

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.cpp
# Opt level: O0

bool ReadDSC(MemFile *file,shared_ptr<Disk> *disk)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  byte *pbVar7;
  exception *peVar8;
  ulong uVar9;
  ssize_t sVar10;
  element_type *peVar11;
  undefined7 uVar12;
  size_t __nbytes;
  Header *header_;
  char *local_228;
  allocator<unsigned_char> local_219;
  undefined1 local_218 [8];
  Data data;
  char *pcStack_1f8;
  int offset_2;
  byte local_1ec;
  byte local_1eb;
  byte local_1ea;
  allocator<unsigned_char> local_1e9;
  undefined1 local_1e8 [4];
  DSC_DATA dd;
  char *local_1d0;
  uint local_1c4;
  Header local_1c0;
  undefined1 local_1b0 [8];
  Sector sector;
  byte local_162;
  byte local_161;
  byte local_160;
  byte local_15f;
  byte local_15e;
  value_type local_15d;
  int iStack_15c;
  DSC_SECTOR ds;
  int i;
  CylHead cylhead;
  Track track;
  DSC_TRACK dh;
  size_t offset_1;
  string local_118;
  long local_f8;
  size_t offset;
  allocator<char> local_d9;
  string local_d8;
  MemFile *local_b8;
  MemFile *pfileData;
  MemFile *pfileHeader;
  MemFile file2;
  string strPath;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  MemFile::rewind(file,(FILE *)disk);
  psVar6 = MemFile::path_abi_cxx11_(file);
  std::__cxx11::string::string((string *)&file2.m_compress,(string *)psVar6);
  MemFile::MemFile((MemFile *)&pfileHeader);
  local_b8 = (MemFile *)&pfileHeader;
  pfileData = file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"hdr",&local_d9);
  bVar2 = IsFileExt((string *)&file2.m_compress,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  if (bVar2) {
    local_f8 = std::__cxx11::string::length();
    local_f8 = local_f8 + -3;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    bVar1 = *pbVar7;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    uVar12 = (undefined7)((ulong)file >> 8);
    *pbVar7 = bVar1 & 0x20 | 0x44;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    bVar1 = *pbVar7;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    *pbVar7 = bVar1 & 0x20 | 0x53;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    bVar1 = *pbVar7;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    __nbytes = CONCAT71(uVar12,bVar1) & 0xffffffffffffff20 | 0x43;
    *pbVar7 = bVar1 & 0x20 | 0x43;
    uVar3 = MemFile::open((MemFile *)&pfileHeader,(char *)&file2.m_compress,1);
    if ((uVar3 & 1) == 0) {
      peVar8 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar8,(char (*) [28])"missing .dsc companion file");
      __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"dsc",(allocator<char> *)((long)&offset_1 + 7));
    bVar2 = IsFileExt((string *)&file2.m_compress,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&offset_1 + 7));
    if (!bVar2) {
      file_local._7_1_ = false;
      goto LAB_0026b6ac;
    }
    std::__cxx11::string::length();
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    bVar1 = *pbVar7;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    uVar12 = (undefined7)((ulong)file >> 8);
    *pbVar7 = bVar1 & 0x20 | 0x48;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    bVar1 = *pbVar7;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    *pbVar7 = bVar1 & 0x20 | 0x44;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    bVar1 = *pbVar7;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)&file2.m_compress);
    __nbytes = CONCAT71(uVar12,bVar1) & 0xffffffffffffff20 | 0x52;
    *pbVar7 = bVar1 & 0x20 | 0x52;
    uVar3 = MemFile::open((MemFile *)&pfileHeader,(char *)&file2.m_compress,1);
    if ((uVar3 & 1) == 0) {
      peVar8 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar8,(char (*) [28])"missing .hdr companion file");
      __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
    }
    std::swap<MemFile*>(&pfileData,&local_b8);
  }
  while (uVar9 = MemFile::read(pfileData,(int)&track + 0x1a,(void *)0x2,__nbytes), (uVar9 & 1) != 0)
  {
    Track::Track((Track *)&cylhead,0);
    CylHead::CylHead((CylHead *)&((DSC_SECTOR *)((long)register0x00000020 + -0x15a))->sector,
                     (uint)(track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ >> 1),
                     track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._2_1_ & 1);
    for (iStack_15c = 0;
        __nbytes = (size_t)track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_,
        iStack_15c <
        (int)(uint)track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._3_1_; iStack_15c = iStack_15c + 1) {
      sVar10 = MemFile::read(pfileData,(int)&local_162,(void *)0x6,1);
      if ((int)sVar10 == 0) {
        peVar8 = (exception *)__cxa_allocate_exception(0x10);
        sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)CHS(ds._2_4_,i,iStack_15c);
        util::exception::exception<char_const(&)[22],char_const*>
                  (peVar8,(char (*) [22])"short file reading %s",
                   (char **)&sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
      }
      Header::Header(&local_1c0,(uint)local_162,(uint)local_161,(uint)local_160,(uint)local_15f);
      header_ = &local_1c0;
      Sector::Sector((Sector *)local_1b0,_250K,MFM,header_,0);
      if ((local_15e & 0xfd) != 0) {
        local_1c4 = local_15e & 0xfffffffd;
        local_1d0 = CHSR(ds._2_4_,i,iStack_15c,(uint)local_160);
        header_ = (Header *)&local_1d0;
        Message<int,char_const*>
                  (msgWarning,"unknown flags [%02X] for %s",(int *)&local_1c4,(char **)header_);
      }
      if ((local_15e & 2) == 0) {
        uVar9 = MemFile::read(pfileData,(int)&local_1ec,(void *)0x3,(size_t)header_);
        if ((uVar9 & 1) == 0) {
          peVar8 = (exception *)__cxa_allocate_exception(0x10);
          pcStack_1f8 = CHSR(ds._2_4_,i,iStack_15c,sector.header.cyl);
          util::exception::exception<char_const(&)[20],char_const*>
                    (peVar8,(char (*) [20])"short file reading ",&stack0xfffffffffffffe08);
          __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
        }
        uVar3 = (uint)local_1ea << 0x18 | (uint)local_1eb << 0x10 | (uint)local_1ec << 8;
        data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = uVar3;
        uVar5 = MemFile::tell(local_b8);
        if (uVar3 != uVar5) {
          data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = MemFile::tell(local_b8);
          Message<int&,int>(msgWarning,"header offset (%lu) != data pointer (%lu)",
                            (int *)((long)&data.
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           .
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            (int *)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                    .
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        iVar4 = Sector::size((Sector *)local_1b0);
        std::allocator<unsigned_char>::allocator(&local_219);
        Data::vector((Data *)local_218,(long)iVar4,&local_219);
        std::allocator<unsigned_char>::~allocator(&local_219);
        bVar2 = MemFile::read<Data>(local_b8,(Data *)local_218);
        if (!bVar2) {
          peVar8 = (exception *)__cxa_allocate_exception(0x10);
          local_228 = CHSR(ds._2_4_,i,iStack_15c,sector.header.cyl);
          util::exception::exception<char_const(&)[27],char_const*>
                    (peVar8,(char (*) [27])"short file reading %s data",&local_228);
          __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
        }
        Sector::add((Sector *)local_1b0,(Data *)local_218,false,0xfb);
        Data::~Data((Data *)local_218);
      }
      else {
        iVar4 = Sector::size((Sector *)local_1b0);
        std::allocator<unsigned_char>::allocator(&local_1e9);
        Data::vector((Data *)local_1e8,(long)iVar4,&local_15d,&local_1e9);
        Sector::add((Sector *)local_1b0,(Data *)local_1e8,false,0xfb);
        Data::~Data((Data *)local_1e8);
        std::allocator<unsigned_char>::~allocator(&local_1e9);
      }
      Track::add((Track *)&cylhead,(Sector *)local_1b0);
      Sector::~Sector((Sector *)local_1b0);
    }
    peVar11 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)disk
                        );
    Disk::write(peVar11,(int)(DSC_SECTOR *)((long)register0x00000020 + -0x15a) + 2,&cylhead,__nbytes
               );
    Track::~Track((Track *)&cylhead);
  }
  peVar11 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)disk);
  std::__cxx11::string::operator=((string *)&peVar11->strType,"DSC");
  file_local._7_1_ = true;
LAB_0026b6ac:
  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  MemFile::~MemFile((MemFile *)&pfileHeader);
  std::__cxx11::string::~string((string *)&file2.m_compress);
  return file_local._7_1_;
}

Assistant:

bool ReadDSC(MemFile& file, std::shared_ptr<Disk>& disk)
{
    file.rewind();

    // ToDo: std::string for file extension
    std::string strPath = file.path();
    MemFile file2;
    MemFile* pfileHeader = &file, * pfileData = &file2;

    // If we've been given the header, open the data file
    if (IsFileExt(strPath, "hdr"))
    {
        // HDR->DSC (preserving case)
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'D' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'S' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'C' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .dsc companion file");
    }
    // Or if given the data file, switch to the header
    else if (IsFileExt(strPath, "dsc"))
    {
        // DSC->HDR
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'H' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'D' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'R' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .hdr companion file");

        std::swap(pfileHeader, pfileData);
    }
    // Reject other file extensions
    else
        return false;

    for (;;)
    {
        DSC_TRACK dh;
        if (!pfileHeader->read(&dh, sizeof(dh)))
            break;

        Track track;
        CylHead cylhead(dh.cyl, dh.head);

        for (int i = 0; i < dh.sectors; ++i)
        {
            DSC_SECTOR ds;
            if (!pfileHeader->read(&ds, sizeof(ds), 1))
                throw util::exception("short file reading %s", CHS(cylhead.cyl, cylhead.head, i));

            Sector sector(DataRate::_250K, Encoding::MFM, Header(ds.cyl, ds.head, ds.sector, ds.size));

            if (ds.flags & ~0x02)
                Message(msgWarning, "unknown flags [%02X] for %s", ds.flags & ~0x02, CHSR(cylhead.cyl, cylhead.head, i, ds.sector));

            // b1 of flags indicates fill byte
            if (ds.flags & 0x02)
                sector.add(Data(sector.size(), ds.fill));
            else
            {
                DSC_DATA dd;
                if (!pfileHeader->read(&dd, sizeof(dd)))
                    throw util::exception("short file reading ", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));

                auto offset = (dd.bOff16M << 24) | (dd.bOff64K << 16) | (dd.bOff256 << 8);
                if (offset != pfileData->tell())
                    Message(msgWarning, "header offset (%lu) != data pointer (%lu)", offset, pfileData->tell());

                Data data(sector.size());
                if (!pfileData->read(data))
                    throw util::exception("short file reading %s data", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));
                sector.add(std::move(data));
            }

            track.add(std::move(sector));
        }

        disk->write(cylhead, std::move(track));
    }

    disk->strType = "DSC";
    return true;
}